

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-msg.c
# Opt level: O2

wchar_t message_flags(monster_conflict *mon)

{
  _Bool _Var1;
  _Bool _Var2;
  wchar_t wVar3;
  
  _Var1 = panel_contains((mon->grid).y,(mon->grid).x);
  _Var2 = monster_is_obvious((monster *)mon);
  wVar3 = (uint)!_Var1 + L'\x02';
  if (_Var2) {
    wVar3 = (uint)!_Var1;
  }
  return wVar3;
}

Assistant:

static int message_flags(const struct monster *mon)
{
	int flags = 0;

	if (!panel_contains(mon->grid.y, mon->grid.x)) {
		flags |= MON_MSG_FLAG_OFFSCREEN;
	}

	if (!monster_is_obvious(mon)) {
		flags |= MON_MSG_FLAG_INVISIBLE;
	}

	return flags;
}